

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer(void)

{
  uint64_t uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 *unaff_RBX;
  long *plVar4;
  undefined8 in_R9;
  long lVar5;
  int64_t eval_b_3;
  int64_t eval_b_5;
  uv_timer_t never;
  uv_timer_t repeat;
  uv_timer_t once_timers [10];
  long lStack_5d8;
  code *pcStack_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8 [15];
  uint64_t local_540 [15];
  undefined8 local_4c8 [150];
  
  plVar4 = &local_5c8;
  pcStack_5d0 = (code *)0x1d61f5;
  uVar3 = uv_default_loop();
  pcStack_5d0 = (code *)0x1d61fd;
  start_time = uv_now(uVar3);
  local_4c8[0] = 0;
  local_540[0] = start_time;
  if ((long)start_time < 1) {
LAB_001d652c:
    pcStack_5d0 = (code *)0x1d6541;
    run_test_timer_cold_1();
LAB_001d6541:
    pcStack_5d0 = (code *)0x1d654e;
    run_test_timer_cold_4();
LAB_001d654e:
    pcStack_5d0 = (code *)0x1d655b;
    run_test_timer_cold_5();
LAB_001d655b:
    pcStack_5d0 = (code *)0x1d6568;
    run_test_timer_cold_6();
LAB_001d6568:
    pcStack_5d0 = (code *)0x1d6575;
    run_test_timer_cold_7();
LAB_001d6575:
    pcStack_5d0 = (code *)0x1d6582;
    run_test_timer_cold_8();
LAB_001d6582:
    pcStack_5d0 = (code *)0x1d658f;
    run_test_timer_cold_9();
LAB_001d658f:
    pcStack_5d0 = (code *)0x1d659c;
    run_test_timer_cold_10();
LAB_001d659c:
    pcStack_5d0 = (code *)0x1d65a9;
    run_test_timer_cold_11();
LAB_001d65a9:
    pcStack_5d0 = (code *)0x1d65b6;
    run_test_timer_cold_12();
  }
  else {
    unaff_RBX = local_4c8;
    lVar5 = 0;
    uVar1 = start_time;
    do {
      local_540[0] = uVar1;
      pcStack_5d0 = (code *)0x1d6245;
      uVar3 = uv_default_loop();
      pcStack_5d0 = (code *)0x1d6250;
      iVar2 = uv_timer_init(uVar3,unaff_RBX);
      local_540[0] = (uint64_t)iVar2;
      local_5b8[0] = 0;
      if (local_540[0] != 0) {
LAB_001d651a:
        pcStack_5d0 = (code *)0x1d652c;
        run_test_timer_cold_2();
        goto LAB_001d652c;
      }
      pcStack_5d0 = (code *)0x1d6286;
      iVar2 = uv_timer_start(unaff_RBX,once_cb,lVar5,0);
      local_540[0] = (uint64_t)iVar2;
      local_5b8[0] = 0;
      if (local_540[0] != 0) {
        pcStack_5d0 = (code *)0x1d651a;
        run_test_timer_cold_3();
        goto LAB_001d651a;
      }
      unaff_RBX = unaff_RBX + 0xf;
      lVar5 = lVar5 + 0x32;
      uVar1 = 0;
    } while (lVar5 != 500);
    pcStack_5d0 = (code *)0x1d62c2;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d62d2;
    iVar2 = uv_timer_init(uVar3,local_540);
    local_5b8[0] = (long)iVar2;
    local_5c8 = 0;
    if (local_5b8[0] != 0) goto LAB_001d6541;
    pcStack_5d0 = (code *)0x1d630e;
    iVar2 = uv_timer_start(local_540,repeat_cb,100,100);
    local_5b8[0] = (long)iVar2;
    local_5c8 = 0;
    if (local_5b8[0] != 0) goto LAB_001d654e;
    pcStack_5d0 = (code *)0x1d6331;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d633e;
    iVar2 = uv_timer_init(uVar3,local_5b8);
    local_5c8 = (long)iVar2;
    local_5c0 = 0;
    if (local_5c8 != 0) goto LAB_001d655b;
    pcStack_5d0 = (code *)0x1d6377;
    iVar2 = uv_timer_start(local_5b8,never_cb,100,100);
    local_5c8 = (long)iVar2;
    local_5c0 = 0;
    if (local_5c8 != 0) goto LAB_001d6568;
    pcStack_5d0 = (code *)0x1d639f;
    iVar2 = uv_timer_stop(local_5b8);
    local_5c8 = (long)iVar2;
    local_5c0 = 0;
    if (local_5c8 != 0) goto LAB_001d6575;
    pcStack_5d0 = (code *)0x1d63c7;
    uv_unref(local_5b8);
    pcStack_5d0 = (code *)0x1d63cc;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d63d6;
    uv_run(uVar3,0);
    local_5c8 = 10;
    local_5c0 = (long)once_cb_called;
    if (local_5c0 != 10) goto LAB_001d6582;
    local_5c8 = 10;
    local_5c0 = (long)once_close_cb_called;
    if (local_5c0 != 10) goto LAB_001d658f;
    pcStack_5d0 = (code *)0x1d6430;
    printf("repeat_cb_called %d\n",(ulong)(uint)repeat_cb_called);
    local_5c8 = 5;
    local_5c0 = (long)repeat_cb_called;
    if (local_5c0 != 5) goto LAB_001d659c;
    local_5c8 = 1;
    local_5c0 = (long)repeat_close_cb_called;
    if (local_5c0 != 1) goto LAB_001d65a9;
    local_5c8 = 500;
    pcStack_5d0 = (code *)0x1d6483;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d648b;
    local_5c0 = uv_now(uVar3);
    local_5c0 = local_5c0 - start_time;
    if (local_5c8 <= local_5c0) {
      pcStack_5d0 = (code *)0x1d64ab;
      unaff_RBX = (undefined8 *)uv_default_loop();
      pcStack_5d0 = (code *)0x1d64bf;
      uv_walk(unaff_RBX,close_walk_cb,0);
      pcStack_5d0 = (code *)0x1d64c9;
      uv_run(unaff_RBX,0);
      local_5c8 = 0;
      pcStack_5d0 = (code *)0x1d64d6;
      uVar3 = uv_default_loop();
      pcStack_5d0 = (code *)0x1d64de;
      iVar2 = uv_loop_close(uVar3);
      local_5c0 = (long)iVar2;
      if (local_5c8 == local_5c0) {
        pcStack_5d0 = (code *)0x1d64f9;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d65c3;
    }
  }
  pcStack_5d0 = (code *)0x1d65c3;
  run_test_timer_cold_14();
LAB_001d65c3:
  pcStack_5d0 = once_cb;
  run_test_timer_cold_13();
  pcStack_5d0 = (code *)unaff_RBX;
  printf("ONCE_CB %d\n",(ulong)(uint)once_cb_called);
  if (plVar4 == (long *)0x0) {
    once_cb_cold_2();
  }
  else {
    iVar2 = uv_is_active(plVar4);
    lStack_5d8 = (long)iVar2;
    if (lStack_5d8 == 0) {
      once_cb_called = once_cb_called + 1;
      uv_close(plVar4,once_close_cb);
      uVar3 = uv_default_loop();
      iVar2 = uv_update_time(uVar3);
      return iVar2;
    }
  }
  plVar4 = &lStack_5d8;
  once_cb_cold_1();
  puts("REPEAT_CB");
  if (plVar4 == (long *)0x0) {
    repeat_cb_cold_2();
  }
  else {
    iVar2 = uv_is_active(plVar4);
    if (iVar2 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        iVar2 = uv_close(plVar4,repeat_close_cb);
        return iVar2;
      }
      return repeat_cb_called;
    }
  }
  repeat_cb_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,0x6f,"never_cb should never be called",in_R9,plVar4);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(timer) {
  uv_timer_t once_timers[10];
  uv_timer_t *once;
  uv_timer_t repeat, never;
  unsigned int i;
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT_LT(0, start_time);

  /* Let 10 timers time out in 500 ms total. */
  for (i = 0; i < ARRAY_SIZE(once_timers); i++) {
    once = once_timers + i;
    r = uv_timer_init(uv_default_loop(), once);
    ASSERT_OK(r);
    r = uv_timer_start(once, once_cb, i * 50, 0);
    ASSERT_OK(r);
  }

  /* The 11th timer is a repeating timer that runs 4 times */
  r = uv_timer_init(uv_default_loop(), &repeat);
  ASSERT_OK(r);
  r = uv_timer_start(&repeat, repeat_cb, 100, 100);
  ASSERT_OK(r);

  /* The 12th timer should not do anything. */
  r = uv_timer_init(uv_default_loop(), &never);
  ASSERT_OK(r);
  r = uv_timer_start(&never, never_cb, 100, 100);
  ASSERT_OK(r);
  r = uv_timer_stop(&never);
  ASSERT_OK(r);
  uv_unref((uv_handle_t*)&never);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(10, once_cb_called);
  ASSERT_EQ(10, once_close_cb_called);
  printf("repeat_cb_called %d\n", repeat_cb_called);
  ASSERT_EQ(5, repeat_cb_called);
  ASSERT_EQ(1, repeat_close_cb_called);

  ASSERT_LE(500, uv_now(uv_default_loop()) - start_time);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}